

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult cpacr_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = env->features;
  uVar3 = (uint)uVar1;
  if ((uVar3 >> 0x1b & 1) == 0) {
    return CP_ACCESS_OK;
  }
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar2 = env->pstate >> 2 & 3;
      goto LAB_00619617;
    }
    uVar2 = env->uncached_cpsr & 0x1f;
    if ((uVar2 < 0x1b) && ((0x4410000U >> uVar2 & 1) != 0)) goto LAB_0061968d;
    if ((uVar1 >> 0x21 & 1) == 0) goto LAB_0061961c;
    if (uVar2 == 0x16) {
      if ((uVar3 >> 0x1c & 1) != 0) goto LAB_0061961c;
    }
    else if ((uVar1 & 0x10000000) != 0 || ((env->cp15).scr_el3 & 1) != 0) goto LAB_0061961c;
LAB_0061968d:
    uVar2 = env->uncached_cpsr & 0x1f;
    if (uVar2 == 0x10) goto LAB_0061970b;
    if (uVar2 == 0x16) {
      return CP_ACCESS_OK;
    }
    if ((uVar2 == 0x1a) || ((uVar1 >> 0x21 & 1) == 0)) goto LAB_0061970b;
    if (uVar2 != 0x16) {
      if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
        return CP_ACCESS_OK;
      }
      goto LAB_0061970b;
    }
    uVar3 = uVar3 >> 0x1c & 1;
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_0061961c;
    uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_00619617:
    if (uVar2 == 1) {
LAB_0061961c:
      if ((*(byte *)((long)(env->cp15).cptr_el + 0x13) & 0x80) != 0) {
        if ((uVar1 >> 0x21 & 1) == 0) {
          return CP_ACCESS_TRAP_EL2;
        }
        if (env->aarch64 == 0) {
          if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_006196cb;
        }
        else if ((~env->pstate & 0xc) != 0) {
LAB_006196cb:
          if (((env->cp15).scr_el3 & 1) != 0) {
            return CP_ACCESS_TRAP_EL2;
          }
        }
      }
    }
    if ((uVar3 >> 9 & 1) != 0) goto LAB_0061970b;
    if (env->aarch64 == 0) goto LAB_0061968d;
    uVar3 = ~env->pstate & 0xc;
  }
  if (uVar3 == 0) {
    return CP_ACCESS_OK;
  }
LAB_0061970b:
  if ((*(byte *)((long)(env->cp15).cptr_el + 0x1b) & 0x80) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static CPAccessResult cpacr_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                   bool isread)
{
    if (arm_feature(env, ARM_FEATURE_V8)) {
        /* Check if CPACR accesses are to be trapped to EL2 */
        if (arm_current_el(env) == 1 &&
            (env->cp15.cptr_el[2] & CPTR_TCPAC) && !arm_is_secure(env)) {
            return CP_ACCESS_TRAP_EL2;
        /* Check if CPACR accesses are to be trapped to EL3 */
        } else if (arm_current_el(env) < 3 &&
                   (env->cp15.cptr_el[3] & CPTR_TCPAC)) {
            return CP_ACCESS_TRAP_EL3;
        }
    }

    return CP_ACCESS_OK;
}